

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRun.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char *__s1;
  int iVar2;
  ulong uVar3;
  bool verbose;
  bool local_44;
  bool local_40;
  bool local_3c;
  bool local_38;
  bool local_34;
  
  if (argc < 2) {
    verbose = false;
    local_38 = false;
    local_3c = false;
    local_40 = false;
    local_44 = false;
    local_34 = false;
  }
  else {
    uVar3 = 1;
    local_34 = false;
    local_44 = false;
    local_40 = false;
    local_3c = false;
    local_38 = false;
    verbose = false;
    do {
      __s1 = argv[uVar3];
      iVar2 = strcmp(__s1,"--verbose");
      if (iVar2 == 0) {
LAB_001b9f7a:
        verbose = true;
      }
      else {
        cVar1 = *__s1;
        if (cVar1 == '-') {
          if ((__s1[1] == 'v') && (__s1[2] == '\0')) goto LAB_001b9f7a;
          iVar2 = strcmp(__s1,"--speed");
          if (iVar2 == 0) {
LAB_001b9fe5:
            local_38 = true;
          }
          else {
            if (__s1[1] == 's') {
              if (__s1[2] == '\0') goto LAB_001b9fe5;
              iVar2 = strcmp(__s1,"--output");
            }
            else {
              iVar2 = strcmp(__s1,"--output");
            }
            if ((iVar2 == 0) || ((__s1[1] == 'o' && (__s1[2] == '\0')))) goto LAB_001ba049;
            iVar2 = strcmp(__s1,"--translate");
            if (iVar2 == 0) {
LAB_001ba051:
              local_40 = true;
            }
            else {
LAB_001ba028:
              if (__s1[1] == 't') {
                if (__s1[2] == '\0') goto LAB_001ba051;
                iVar2 = strcmp(__s1,"--executable");
                if (iVar2 != 0) goto LAB_001ba072;
              }
              else {
                iVar2 = strcmp(__s1,"--executable");
                if (iVar2 != 0) {
                  if (cVar1 != '-') goto LAB_001ba09b;
LAB_001ba072:
                  if ((__s1[1] != 'e') || (__s1[2] != '\0')) {
                    iVar2 = strcmp(__s1,"--time-trace");
                    if (iVar2 != 0) goto LAB_001ba0b4;
                    goto LAB_001ba0c0;
                  }
                }
              }
LAB_001ba093:
              local_44 = true;
            }
          }
        }
        else {
          iVar2 = strcmp(__s1,"--speed");
          if (iVar2 == 0) goto LAB_001b9fe5;
          iVar2 = strcmp(__s1,"--output");
          if (iVar2 == 0) {
LAB_001ba049:
            local_3c = true;
            goto LAB_001ba0c6;
          }
          iVar2 = strcmp(__s1,"--translate");
          if (iVar2 == 0) goto LAB_001ba051;
          if (cVar1 == '-') goto LAB_001ba028;
          iVar2 = strcmp(__s1,"--executable");
          if (iVar2 == 0) goto LAB_001ba093;
LAB_001ba09b:
          iVar2 = strcmp(__s1,"--time-trace");
          if (iVar2 != 0) {
            if (cVar1 != '-') goto LAB_001ba0c6;
LAB_001ba0b4:
            if ((__s1[1] != 'r') || (__s1[2] != '\0')) goto LAB_001ba0c6;
          }
LAB_001ba0c0:
          local_34 = true;
        }
      }
LAB_001ba0c6:
      uVar3 = uVar3 + 1;
    } while ((uint)argc != uVar3);
  }
  iVar2 = RunTests(verbose,(_func_char_ptr_char_ptr_uint_ptr *)0x0,(_func_void_char_ptr *)0x0,
                   local_38,local_3c,local_40,local_44,local_34);
  return iVar2;
}

Assistant:

int main(int argc, char** argv)
{
	(void)argv;

	bool verbose = false;
	bool runSpeedTests = false;
	bool testOutput = false;
	bool testTranslationSave = false;
	bool testTranslation = false;
	bool testTimeTrace = false;

	for(int i = 1; i < argc; i++)
	{
		if(strcmp(argv[i], "--verbose") == 0 || strcmp(argv[i], "-v") == 0)
			verbose = true;
		else if(strcmp(argv[i], "--speed") == 0 || strcmp(argv[i], "-s") == 0)
			runSpeedTests = true;
		else if(strcmp(argv[i], "--output") == 0 || strcmp(argv[i], "-o") == 0)
			testOutput = true;
		else if(strcmp(argv[i], "--translate") == 0 || strcmp(argv[i], "-t") == 0)
			testTranslationSave = true;
		else if(strcmp(argv[i], "--executable") == 0 || strcmp(argv[i], "-e") == 0)
			testTranslation = true;
		else if(strcmp(argv[i], "--time-trace") == 0 || strcmp(argv[i], "-r") == 0)
			testTimeTrace = true;
	}

	return RunTests(verbose, 0, 0, runSpeedTests, testOutput, testTranslationSave, testTranslation, testTimeTrace);
}